

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O3

void FT_Stream_ExitFrame(FT_Stream stream)

{
  if (stream->read != (FT_Stream_IoFunc)0x0) {
    if (stream->base != (uchar *)0x0) {
      (*stream->memory->free)(stream->memory,stream->base);
    }
    stream->base = (uchar *)0x0;
  }
  stream->cursor = (uchar *)0x0;
  stream->limit = (uchar *)0x0;
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_Stream_ExitFrame( FT_Stream  stream )
  {
    /* IMPORTANT: The assertion stream->cursor != 0 was removed, given    */
    /*            that it is possible to access a frame of length 0 in    */
    /*            some weird fonts (usually, when accessing an array of   */
    /*            0 records, like in some strange kern tables).           */
    /*                                                                    */
    /*  In this case, the loader code handles the 0-length table          */
    /*  gracefully; however, stream.cursor is really set to 0 by the      */
    /*  FT_Stream_EnterFrame() call, and this is not an error.            */
    /*                                                                    */
    FT_ASSERT( stream );

    if ( stream->read )
    {
      FT_Memory  memory = stream->memory;

#ifdef FT_DEBUG_MEMORY
      ft_mem_free( memory, stream->base );
      stream->base = NULL;
#else
      FT_FREE( stream->base );
#endif
    }
    stream->cursor = NULL;
    stream->limit  = NULL;
  }